

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

string * __thiscall Graph::to_string_abi_cxx11_(string *__return_storage_ptr__,Graph *this)

{
  long *plVar1;
  long *plVar2;
  pointer this_00;
  pointer this_01;
  long *local_78;
  long local_68;
  long lStack_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"digraph G { \n","");
  this_00 = (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      Node::to_string_abi_cxx11_(&local_58,this_00);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_68 = *plVar2;
        lStack_60 = plVar1[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar2;
        local_78 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this_01 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_01 !=
      (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      Connection::to_string_abi_cxx11_(&local_58,this_01);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_68 = *plVar2;
        lStack_60 = plVar1[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar2;
        local_78 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  if ((this->rankdir)._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&this->rankdir,0,(char *)0x0,0x14b1ae);
  }
  std::operator+(&local_58,"rankdir=",&this->rankdir);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_68 = *plVar2;
    lStack_60 = plVar1[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar2;
    local_78 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Graph::to_string() {
    string str = "digraph G { \n";
    for (vector<Node>::iterator node = nodes.begin(); node != nodes.end(); ++node) {
        str += node->to_string() + "\n";
    }
    for (vector<Connection>::iterator connection = connections.begin(); connection != connections.end(); ++connection) {
        str += connection->to_string() + "\n";
    }
    if (rankdir.empty()) {
        rankdir = "LR";
    }
    str += "rankdir=" + rankdir + "\n}";
    return str;
}